

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFunctionCommand.cxx
# Opt level: O0

cmCommand * __thiscall cmFunctionHelperCommand::Clone(cmFunctionHelperCommand *this)

{
  cmFunctionHelperCommand *this_00;
  cmFunctionHelperCommand *newC;
  cmFunctionHelperCommand *this_local;
  
  this_00 = (cmFunctionHelperCommand *)operator_new(0xa8);
  cmFunctionHelperCommand(this_00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this_00->Args,&this->Args);
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::operator=
            (&this_00->Functions,&this->Functions);
  memcpy(&this_00->Policies,&this->Policies,0x28);
  std::__cxx11::string::operator=((string *)&this_00->FilePath,(string *)&this->FilePath);
  return &this_00->super_cmCommand;
}

Assistant:

cmCommand* Clone() override
  {
    cmFunctionHelperCommand* newC = new cmFunctionHelperCommand;
    // we must copy when we clone
    newC->Args = this->Args;
    newC->Functions = this->Functions;
    newC->Policies = this->Policies;
    newC->FilePath = this->FilePath;
    return newC;
  }